

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EntityMarking::SetEntityMarkingString
          (EntityMarking *this,KINT8 *EMS,KUINT16 StringSize)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (StringSize < 0xc) {
    memcpy(this->m_sEntityMarkingString,EMS,(ulong)StringSize);
    this->m_sEntityMarkingString[StringSize] = '\0';
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SetEntityMarkingString",&local_39);
  KException::KException(this_00,&local_38,3);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityMarking::SetEntityMarkingString(const KINT8 *EMS, KUINT16 StringSize) noexcept(false)
{
    if( StringSize > 11 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    memcpy( m_sEntityMarkingString, EMS, StringSize );
    m_sEntityMarkingString[StringSize] = 0x0; // Null terminate the string.
}